

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.cpp
# Opt level: O1

int ncnn::rnn(Mat *bottom_blob,Mat *top_blob,int reverse,Mat *weight_xc,Mat *bias_c,Mat *weight_hc,
             Mat *hidden_state,Option *opt)

{
  undefined4 uVar1;
  uint uVar2;
  uint uVar3;
  uint _w;
  int iVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  void *pvVar8;
  void *pvVar9;
  void *pvVar10;
  void *pvVar11;
  void *pvVar12;
  size_t sVar13;
  size_t sVar14;
  void *pvVar15;
  size_t sVar16;
  void *pvVar17;
  int *piVar18;
  void *pvVar19;
  int i;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  void *pvVar23;
  int iVar24;
  void *pvVar25;
  uint uVar26;
  ulong uVar27;
  float fVar28;
  Mat gates;
  Mat local_78;
  
  uVar2 = bottom_blob->w;
  uVar3 = bottom_blob->h;
  _w = top_blob->w;
  uVar27 = (ulong)_w;
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78._20_8_ = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  Mat::create(&local_78,_w,4,opt->workspace_allocator);
  pvVar19 = local_78.data;
  iVar24 = -100;
  if ((local_78.data != (void *)0x0) && ((long)local_78.c * local_78.cstep != 0)) {
    if (0 < (int)uVar3) {
      iVar24 = bottom_blob->w;
      sVar7 = bottom_blob->elemsize;
      pvVar8 = bottom_blob->data;
      pvVar9 = weight_xc->data;
      iVar4 = weight_xc->w;
      pvVar10 = weight_hc->data;
      iVar5 = weight_hc->w;
      pvVar11 = bias_c->data;
      pvVar12 = top_blob->data;
      iVar6 = top_blob->w;
      sVar13 = top_blob->elemsize;
      sVar14 = weight_xc->elemsize;
      pvVar15 = hidden_state->data;
      sVar16 = weight_hc->elemsize;
      uVar26 = 0;
      do {
        uVar20 = ~uVar26 + uVar3;
        if (reverse == 0) {
          uVar20 = uVar26;
        }
        if (0 < (int)_w) {
          pvVar17 = hidden_state->data;
          uVar22 = 0;
          pvVar23 = pvVar10;
          pvVar25 = pvVar9;
          do {
            fVar28 = *(float *)((long)pvVar11 + uVar22 * 4);
            if (0 < (int)uVar2) {
              uVar21 = 0;
              do {
                fVar28 = fVar28 + *(float *)((long)pvVar8 +
                                            uVar21 * 4 + (long)iVar24 * sVar7 * (long)(int)uVar20) *
                                  *(float *)((long)pvVar25 + uVar21 * 4);
                uVar21 = uVar21 + 1;
              } while (uVar2 != uVar21);
            }
            uVar21 = 0;
            do {
              fVar28 = fVar28 + *(float *)((long)pvVar17 + uVar21 * 4) *
                                *(float *)((long)pvVar23 + uVar21 * 4);
              uVar21 = uVar21 + 1;
            } while (uVar27 != uVar21);
            fVar28 = tanhf(fVar28);
            *(float *)((long)pvVar19 + uVar22 * 4) = fVar28;
            uVar22 = uVar22 + 1;
            pvVar25 = (void *)((long)pvVar25 + (long)iVar4 * sVar14);
            pvVar23 = (void *)((long)pvVar23 + (long)iVar5 * sVar16);
          } while (uVar22 != uVar27);
        }
        if (0 < (int)_w) {
          uVar22 = 0;
          do {
            uVar1 = *(undefined4 *)((long)pvVar19 + uVar22 * 4);
            *(undefined4 *)((long)pvVar15 + uVar22 * 4) = uVar1;
            *(undefined4 *)((long)pvVar12 + uVar22 * 4 + (long)(int)uVar20 * (long)iVar6 * sVar13) =
                 uVar1;
            uVar22 = uVar22 + 1;
          } while (uVar27 != uVar22);
        }
        uVar26 = uVar26 + 1;
      } while (uVar26 != uVar3);
    }
    iVar24 = 0;
  }
  piVar18 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar18 != (int *)0x0) {
    LOCK();
    *piVar18 = *piVar18 + -1;
    UNLOCK();
    if (*piVar18 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar24;
}

Assistant:

static int rnn(const Mat& bottom_blob, Mat& top_blob, int reverse, const Mat& weight_xc, const Mat& bias_c, const Mat& weight_hc, Mat& hidden_state, const Option& opt)
{
    int size = bottom_blob.w;
    int T = bottom_blob.h;

    int num_output = top_blob.w;

    // num_output
    Mat gates(num_output, 4u, opt.workspace_allocator);
    if (gates.empty())
        return -100;

    // unroll
    for (int t = 0; t < T; t++)
    {
        int ti = reverse ? T - 1 - t : t;

        const float* x = bottom_blob.row(ti);

        for (int q = 0; q < num_output; q++)
        {
            const float* weight_xc_ptr = weight_xc.row(q);

            const float* weight_hc_ptr = weight_hc.row(q);

            float H = bias_c[q];

            for (int i = 0; i < size; i++)
            {
                H += weight_xc_ptr[i] * x[i];
            }

            for (int i = 0; i < num_output; i++)
            {
                H += weight_hc_ptr[i] * hidden_state[i];
            }

            H = tanh(H);

            gates[q] = H;
        }

        float* output_data = top_blob.row(ti);
        for (int q = 0; q < num_output; q++)
        {
            float H = gates[q];

            hidden_state[q] = H;
            output_data[q] = H;
        }
    }

    return 0;
}